

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O3

int caption_frame_from_text(caption_frame_t *frame,utf8_char_t *data)

{
  caption_frame_buffer_t *__src;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  utf8_size_t uVar4;
  ulong uVar5;
  utf8_size_t uVar6;
  
  sVar2 = strlen(data);
  xds_init(&frame->xds);
  frame->timestamp = -1.0;
  *(undefined2 *)&frame->state = 0xe00;
  (frame->state).col = '\0';
  (frame->state).cc_data = 0;
  memset(&frame->front,0,0x1e00);
  __src = &frame->back;
  frame->write = __src;
  if (sVar2 == 0 || *data == '\0') {
LAB_00106345:
    memcpy(&frame->front,__src,0xf00);
    memset(__src,0,0xf00);
    return 0;
  }
  uVar5 = 0;
LAB_001062c5:
  do {
    iVar1 = utf8_char_whitespace(data);
    if (iVar1 != 0) {
      sVar3 = utf8_char_length(data);
      data = data + sVar3;
      sVar2 = sVar2 - sVar3;
      if (sVar2 != 0) goto LAB_001062c5;
      sVar2 = 0;
    }
    uVar4 = utf8_wrap_length(data,0x20);
    if (uVar4 != 0) {
      uVar6 = 0;
      do {
        sVar3 = utf8_char_length(data);
        caption_frame_write_char(frame,(int)uVar5,(int)uVar6,eia608_style_white,0,data);
        data = data + sVar3;
        sVar2 = sVar2 - sVar3;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    uVar5 = (uVar5 + 1) - (ulong)(uVar4 == 0);
    if (((*data == '\0') || (sVar2 == 0)) || (0xe < uVar5)) goto LAB_00106345;
  } while( true );
}

Assistant:

int caption_frame_from_text(caption_frame_t* frame, const utf8_char_t* data)
{
    ssize_t size = (ssize_t)strlen(data);
    caption_frame_init(frame);
    frame->write = &frame->back;

    for (size_t r = 0; (*data) && size && r < SCREEN_ROWS;) {
        // skip whitespace at start of line
        while (size && utf8_char_whitespace(data)) {
            size_t s = utf8_char_length(data);
            data += s, size -= s;
        }

        // get charcter count for wrap (or orest of line)
        utf8_size_t char_count = utf8_wrap_length(data, SCREEN_COLS);
        // write to caption frame
        for (size_t c = 0; c < char_count; ++c) {
            size_t char_length = utf8_char_length(data);
            caption_frame_write_char(frame, r, c, eia608_style_white, 0, data);
            data += char_length, size -= char_length;
        }

        r += char_count ? 1 : 0; // Update row num only if not blank
    }

    caption_frame_end(frame);
    return 0;
}